

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int jumponcond(FuncState *fs,expdesc *e,int cond)

{
  int iVar1;
  uint uVar2;
  
  if ((e->k == VRELOCABLE) && (uVar2 = fs->f->code[(e->u).info], (uVar2 & 0x3f) == 0x1b)) {
    fs->pc = fs->pc + -1;
    uVar2 = (uint)(cond == 0) << 0xe | uVar2 >> 0x11 & 0xffffffc0 | 0x22;
  }
  else {
    discharge2anyreg(fs,e);
    if ((e->k == VNONRELOC) &&
       ((((uint)(e->u).info >> 8 & 1) == 0 && ((int)(uint)fs->nactvar <= (e->u).info)))) {
      fs->freereg = fs->freereg + 0xff;
    }
    uVar2 = cond << 0xe | (e->u).info << 0x17 | 0x3fe3;
  }
  luaK_code(fs,uVar2);
  iVar1 = luaK_jump(fs);
  return iVar1;
}

Assistant:

static int jumponcond(FuncState *fs, expdesc *e, int cond) {
    if (e->k == VRELOCABLE) {
        Instruction ie = getinstruction(fs, e);
        if (GET_OPCODE(ie) == OP_NOT) {
            fs->pc--;  /* remove previous OP_NOT */
            return condjump(fs, OP_TEST, GETARG_B(ie), 0, !cond);
        }
        /* else go through */
    }
    discharge2anyreg(fs, e);
    freeexp(fs, e);
    return condjump(fs, OP_TESTSET, NO_REG, e->u.info, cond);
}